

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintSmartPointer<unsigned_char[],std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *ptr,ostream *os,
               char param_3)

{
  ostream *poVar1;
  
  if ((ptr->_M_t).super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) {
    poVar1 = std::operator<<(os,"(");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::operator<<(poVar1,")");
    return;
  }
  std::operator<<(os,"(nullptr)");
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, char) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    // We can't print the value. Just print the pointer..
    *os << "(" << (VoidifyPointer)(ptr.get()) << ")";
  }
}